

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::egl::ChangeSurfaceSizeCase::iterate(ChangeSurfaceSizeCase *this)

{
  ResultCollector *status;
  IVec2 *v;
  EGLSurface pvVar1;
  EGLDisplay pvVar2;
  NativeWindow *pNVar3;
  deUint32 err;
  Library *egl;
  IVec2 oldEglSize;
  ScopedCurrentContext currentCtx;
  Vector<int,_2> local_70;
  Vector<int,_2> local_68;
  ScopedCurrentContext local_60;
  egl local_50 [8];
  Vector<int,_2> local_48;
  Vector<int,_2> local_40;
  Vector<int,_2> local_38;
  
  egl = EglTestContext::getLibrary((this->super_ResizeTest).super_TestCase.m_eglTestCtx);
  pvVar1 = ((this->super_ResizeTest).m_surface.
            super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>.m_data.
           ptr)->m_surface;
  eglu::ScopedCurrentContext::ScopedCurrentContext
            (&local_60,egl,(this->super_ResizeTest).m_display,pvVar1,pvVar1,
             ((this->super_ResizeTest).m_context.
              super_UniqueBase<eglu::UniqueContext,_de::DefaultDeleter<eglu::UniqueContext>_>.m_data
             .ptr)->m_context);
  pvVar1 = ((this->super_ResizeTest).m_surface.
            super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>.m_data.
           ptr)->m_surface;
  pvVar2 = (this->super_ResizeTest).m_display;
  pNVar3 = (this->super_ResizeTest).m_nativeWindow.
           super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>.m_data.ptr;
  tcu::Vector<int,_2>::Vector(&local_38,&(this->super_ResizeTest).m_oldSize);
  status = &(this->super_ResizeTest).m_status;
  checkSurfaceSize((egl *)&local_68,egl,pvVar2,pvVar1,pNVar3,&local_38,status);
  tcu::Vector<int,_2>::Vector(&local_40,&local_68);
  initSurface(&(this->super_ResizeTest).m_gl,&local_40);
  v = &(this->super_ResizeTest).m_newSize;
  tcu::Vector<int,_2>::Vector(&local_48,v);
  ResizeTest::resize(&this->super_ResizeTest,&local_48);
  (*egl->_vptr_Library[0x31])
            (egl,(this->super_ResizeTest).m_display,
             ((this->super_ResizeTest).m_surface.
              super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>.m_data
             .ptr)->m_surface);
  err = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(err,"eglSwapBuffers()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglResizeTests.cpp"
                   ,0x16a);
  pvVar1 = ((this->super_ResizeTest).m_surface.
            super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>.m_data.
           ptr)->m_surface;
  pvVar2 = (this->super_ResizeTest).m_display;
  pNVar3 = (this->super_ResizeTest).m_nativeWindow.
           super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>.m_data.ptr;
  tcu::Vector<int,_2>::Vector(&local_70,v);
  checkSurfaceSize(local_50,egl,pvVar2,pvVar1,pNVar3,&local_70,status);
  tcu::ResultCollector::setTestContextResult
            (status,(this->super_ResizeTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
  ;
  eglu::ScopedCurrentContext::~ScopedCurrentContext(&local_60);
  return STOP;
}

Assistant:

IterateResult ChangeSurfaceSizeCase::iterate (void)
{
	const Library&			egl			= m_eglTestCtx.getLibrary();
	ScopedCurrentContext	currentCtx	(egl, m_display, **m_surface, **m_surface, **m_context);
	IVec2					oldEglSize	= checkSurfaceSize(egl,
														   m_display,
														   **m_surface,
														   *m_nativeWindow,
														   m_oldSize,
														   m_status);

	initSurface(m_gl, oldEglSize);

	this->resize(m_newSize);

	egl.swapBuffers(m_display, **m_surface);
	EGLU_CHECK_MSG(egl, "eglSwapBuffers()");
	checkSurfaceSize(egl, m_display, **m_surface, *m_nativeWindow, m_newSize, m_status);

	m_status.setTestContextResult(m_testCtx);
	return STOP;
}